

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte *s;
  char cVar1;
  byte bVar2;
  FILE *__stream;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  BrotliDecoderResult BVar11;
  char *pcVar12;
  size_t sVar13;
  long lVar14;
  char *pcVar15;
  void *pvVar16;
  BrotliDecoderState *state;
  BrotliEncoderState *state_00;
  undefined8 *puVar17;
  bool bVar18;
  uint32_t value;
  char **ppcVar19;
  long lVar20;
  ulong uVar21;
  byte *pbVar22;
  uint uVar23;
  char *pcVar24;
  bool bVar25;
  int local_1ac;
  int local_1a0;
  ulong local_178;
  ulong local_170;
  undefined1 local_168 [28];
  undefined8 uStack_14c;
  int iStack_144;
  byte *local_140;
  byte *local_138;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  size_t local_e0;
  ulong local_d8;
  int local_d0;
  char **local_c8;
  undefined1 local_c0 [16];
  int local_b0;
  uint8_t *local_a8;
  uint8_t *local_a0;
  uint8_t *local_98;
  undefined1 local_90 [16];
  ulong local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  size_t local_58;
  uint8_t *local_50;
  undefined1 local_48 [16];
  
  local_168._0_4_ = 0xb;
  local_168._4_4_ = -1;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0;
  local_168._16_8_ = 0x100000000;
  stack0xfffffffffffffeb0 = (undefined1  [16])0x0;
  ppcVar19 = (char **)0x0;
  local_140 = (byte *)0x0;
  local_138 = (byte *)0x1450a8;
  local_130 = (undefined1  [16])0x0;
  local_120 = (undefined1  [16])0x0;
  local_110 = (undefined1  [16])0x0;
  local_100 = (undefined1  [16])0x0;
  local_f0 = (undefined1  [16])0x0;
  local_e0 = 1;
  local_d8 = 0;
  uVar8 = 0;
  local_a8 = (uint8_t *)0x0;
  local_c0 = (undefined1  [16])0x0;
  local_b0 = 0;
  local_90 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  pcVar15 = *argv;
  local_d0 = argc;
  local_c8 = argv;
  pcVar12 = strrchr(pcVar15,0x2f);
  pcVar24 = pcVar12 + 1;
  if (pcVar12 == (char *)0x0) {
    pcVar24 = pcVar15;
  }
  pcVar12 = strrchr(pcVar24,0x5c);
  pcVar15 = pcVar12 + 1;
  if (pcVar12 == (char *)0x0) {
    pcVar15 = pcVar24;
  }
  iVar7 = strncmp(pcVar15,"unbrotli",8);
  if (iVar7 == 0) {
    cVar1 = pcVar15[8];
    ppcVar19 = (char **)CONCAT71((int7)((ulong)ppcVar19 >> 8),cVar1 == '.');
    uVar8 = (uint)(cVar1 == '\0' || cVar1 == '.');
  }
  uVar23 = 0;
  if (argc < 2) {
    local_178 = 1;
    local_170 = 0;
  }
  else {
    local_178 = 1;
    iVar7 = 1;
    bVar18 = false;
    bVar25 = false;
    local_1a0 = 0;
    bVar5 = false;
    bVar3 = false;
    local_1ac = 0;
    bVar4 = false;
    local_170 = 0;
    do {
      pcVar15 = argv[iVar7];
      if ((pcVar15 == (char *)0x0) || (sVar13 = strlen(pcVar15), sVar13 == 0)) {
        lVar20 = (long)(int)uVar23;
        uVar23 = uVar23 + 1;
        *(int *)(local_130 + lVar20 * 4) = iVar7;
      }
      else {
        if (0x12 < (int)uVar23) {
          main_cold_28();
          goto LAB_00103c2d;
        }
        if (((bVar18) || (sVar13 == 1)) || (*pcVar15 != '-')) {
          local_170 = local_170 + 1;
          if (local_178 <= sVar13) {
            local_178 = sVar13;
          }
        }
        else {
          lVar20 = (long)(int)uVar23;
          uVar23 = uVar23 + 1;
          *(int *)(local_130 + lVar20 * 4) = iVar7;
          if (sVar13 == 2) {
            bVar18 = true;
            if (pcVar15[1] == '-') goto LAB_00102ee3;
          }
          else if (pcVar15[1] == '-') {
            pbVar22 = (byte *)(pcVar15 + 2);
            iVar9 = strcmp("best",(char *)pbVar22);
            if (iVar9 == 0) {
              if (local_1ac == 0) {
                local_168._0_4_ = 0xb;
                bVar18 = false;
                local_1ac = 1;
                goto LAB_00102ee3;
              }
              main_cold_14();
            }
            else {
              iVar9 = strcmp("decompress",(char *)pbVar22);
              if (iVar9 == 0) {
                if (!bVar4) {
                  bVar4 = true;
                  uVar8 = 1;
LAB_00103443:
                  bVar18 = false;
                  goto LAB_00102ee3;
                }
                main_cold_13();
              }
              else {
                iVar9 = strcmp("force",(char *)pbVar22);
                if (iVar9 == 0) {
                  if (local_168._12_4_ == 0) {
                    local_168._12_4_ = 1;
                    goto LAB_00103443;
                  }
                  main_cold_12();
                }
                else {
                  iVar9 = strcmp("help",(char *)pbVar22);
                  if (iVar9 == 0) {
switchD_0010316e_caseD_68:
                    uVar10 = 2;
                    goto LAB_00103c32;
                  }
                  iVar9 = strcmp("keep",(char *)pbVar22);
                  if (iVar9 == 0) {
                    if (!bVar5) {
                      local_168._16_8_ = local_168._16_8_ & 0xffffffff00000000;
                      bVar5 = true;
                      goto LAB_00103443;
                    }
                    main_cold_11();
                  }
                  else {
                    iVar9 = strcmp("no-copy-stat",(char *)pbVar22);
                    if (iVar9 == 0) {
                      if (local_168._20_4_ != 0) {
                        local_168._16_8_ = local_168._16_8_ & 0xffffffff;
LAB_00103463:
                        bVar18 = false;
                        goto LAB_00102ee3;
                      }
                      main_cold_10();
                    }
                    else {
                      uVar10 = *pbVar22 - 0x72;
                      if ((uVar10 == 0) && (uVar10 = (byte)pcVar15[3] - 0x6d, uVar10 == 0)) {
                        uVar10 = (uint)(byte)pcVar15[4];
                      }
                      if (uVar10 == 0) {
                        if (!bVar5) {
                          local_168._16_4_ = 1;
                          bVar18 = false;
                          bVar5 = true;
                          goto LAB_00102ee3;
                        }
                        main_cold_9();
                      }
                      else {
                        iVar9 = strcmp("stdout",(char *)pbVar22);
                        if (iVar9 == 0) {
                          if (!bVar3) {
                            local_168._24_4_ = 1;
                            bVar3 = true;
                            goto LAB_00103443;
                          }
                          main_cold_8();
                        }
                        else {
                          iVar9 = strcmp("test",(char *)pbVar22);
                          if (iVar9 == 0) {
                            if (!bVar4) {
                              uVar8 = 4;
                              bVar4 = true;
                              goto LAB_00103443;
                            }
                            main_cold_7();
                          }
                          else {
                            iVar9 = strcmp("verbose",(char *)pbVar22);
                            if (iVar9 == 0) {
                              if ((int)local_168._8_4_ < 1) {
                                local_168._8_4_ = 1;
                                goto LAB_00103463;
                              }
                              main_cold_6();
                            }
                            else {
                              iVar9 = strcmp("version",(char *)pbVar22);
                              if (iVar9 == 0) {
LAB_00103bd3:
                                bVar18 = false;
                                fprintf(_stdout,"brotli %d.%d.%d\n",1,0,7);
                                goto LAB_00103d61;
                              }
                              pcVar15 = strrchr((char *)pbVar22,0x3d);
                              if ((pcVar15 == (char *)0x0) || (pcVar15[1] == '\0')) {
                                pcVar15 = "must pass the parameter as --%s=value\n";
                                goto LAB_00103e5a;
                              }
                              s = (byte *)(pcVar15 + 1);
                              sVar13 = (long)pcVar15 - (long)pbVar22;
                              iVar9 = strncmp("lgwin",(char *)pbVar22,sVar13);
                              if (iVar9 == 0) {
                                if (local_1a0 == 0) {
                                  iVar9 = 0x18;
LAB_0010351c:
                                  local_1a0 = ParseInt((char *)s,iVar9,(int)local_168 + 4,
                                                       (int *)ppcVar19);
                                  if (local_1a0 == 0) {
                                    pcVar15 = "error parsing lgwin value [%s]\n";
                                    pbVar22 = s;
                                    goto LAB_00103e5a;
                                  }
                                  bVar18 = 9 < (int)local_168._4_4_ || local_168._4_4_ == 0;
                                  ppcVar19 = (char **)CONCAT71((int7)((ulong)ppcVar19 >> 8),bVar18);
                                  if (bVar18) goto LAB_00103463;
LAB_00103df3:
                                  fprintf(_stderr,
                                          "lgwin parameter (%d) smaller than the minimum (%d)\n",
                                          (ulong)(uint)local_168._4_4_,10);
                                }
                                else {
                                  main_cold_5();
                                }
                              }
                              else {
                                iVar9 = strncmp("large_window",(char *)pbVar22,sVar13);
                                if (iVar9 == 0) {
                                  if (local_1a0 == 0) {
                                    iVar9 = 0x1e;
                                    goto LAB_0010351c;
                                  }
                                  main_cold_4();
                                }
                                else {
                                  iVar9 = strncmp("output",(char *)pbVar22,sVar13);
                                  if (iVar9 == 0) {
                                    if (!bVar3) {
                                      bVar3 = false;
                                      local_140 = s;
                                      goto LAB_00103443;
                                    }
                                    main_cold_3();
                                  }
                                  else {
                                    iVar9 = strncmp("quality",(char *)pbVar22,sVar13);
                                    if (iVar9 == 0) {
                                      if (local_1ac == 0) {
                                        local_1ac = ParseInt((char *)s,0xb,(int)local_168,
                                                             (int *)ppcVar19);
                                        if (local_1ac != 0) goto LAB_00103443;
                                        pcVar15 = "error parsing quality value [%s]\n";
                                        pbVar22 = s;
                                        goto LAB_00103e5a;
                                      }
                                      main_cold_2();
                                    }
                                    else {
                                      iVar9 = strncmp("suffix",(char *)pbVar22,sVar13);
                                      if (iVar9 == 0) {
                                        if (!bVar25) {
                                          bVar18 = false;
                                          bVar25 = true;
                                          local_138 = s;
                                          goto LAB_00102ee3;
                                        }
                                        main_cold_1();
                                      }
                                      else {
                                        pcVar15 = "invalid parameter: [%s]\n";
LAB_00103e5a:
                                        fprintf(_stderr,pcVar15,pbVar22);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
LAB_00103c2d:
            uVar10 = 3;
            goto LAB_00103c32;
          }
          lVar20 = 0;
          do {
            bVar2 = pcVar15[lVar20 + 1];
            bVar18 = bVar4;
            if ((byte)(bVar2 - 0x30) < 10) {
              if (local_1ac == 0) {
                local_168._0_4_ = (char)bVar2 + -0x30;
LAB_0010313d:
                local_1ac = 1;
                goto LAB_00103145;
              }
              main_cold_27();
              goto LAB_00103c2d;
            }
            uVar10 = (uint)bVar2;
            if (uVar10 - 99 < 6) {
              ppcVar19 = (char **)((long)&switchD_0010316e::switchdataD_00145050 +
                                  (long)(int)(&switchD_0010316e::switchdataD_00145050)[uVar10 - 99])
              ;
              switch(uVar10) {
              case 99:
                if (!bVar3) {
                  local_168._24_4_ = 1;
                  bVar3 = true;
                  break;
                }
                main_cold_17();
                goto LAB_00103c2d;
              case 100:
                uVar8 = 1;
                bVar18 = true;
                if (bVar4) {
                  main_cold_16();
                  goto LAB_00103c2d;
                }
                break;
              default:
                goto switchD_0010316e_caseD_65;
              case 0x66:
                if (local_168._12_4_ != 0) {
                  main_cold_15();
                  goto LAB_00103c2d;
                }
                local_168._12_4_ = 1;
                break;
              case 0x68:
                goto switchD_0010316e_caseD_68;
              }
            }
            else {
switchD_0010316e_caseD_65:
              if ((bVar2 & 0xfe) == 0x6a) {
                if (!bVar5) {
                  local_168._17_3_ = 0;
                  local_168[0x10] = uVar10 == 0x6a;
                  bVar5 = true;
                  ppcVar19 = (char **)(ulong)(uVar10 == 0x6a);
                  goto LAB_00103145;
                }
                main_cold_26();
                goto LAB_00103c2d;
              }
              if (bVar2 < 0x5a) {
                if ((bVar2 != 0x44) && (bVar2 != 0x53)) {
                  if (bVar2 != 0x56) goto switchD_00103210_caseD_2;
                  goto LAB_00103bd3;
                }
switchD_00103210_caseD_1:
                if ((((sVar13 - 2 != lVar20) || (iVar7 = iVar7 + 1, iVar7 == argc)) ||
                    (pbVar22 = (byte *)argv[iVar7], pbVar22 == (byte *)0x0)) || (*pbVar22 == 0)) {
                  pcVar15 = "expected parameter for argument -%c\n";
                  goto LAB_00103c11;
                }
                lVar14 = (long)(int)uVar23;
                uVar23 = uVar23 + 1;
                *(int *)(local_130 + lVar14 * 4) = iVar7;
                ppcVar19 = argv;
                if (bVar2 < 0x71) {
                  if (bVar2 == 0x53) {
                    if (bVar25) {
                      main_cold_18();
                      goto LAB_00103c2d;
                    }
                    bVar25 = true;
                    local_138 = pbVar22;
                  }
                  else {
                    if (bVar2 != 0x6f) goto LAB_00103145;
                    if (bVar3) {
                      main_cold_21();
                      goto LAB_00103c2d;
                    }
                    bVar3 = false;
                    local_140 = pbVar22;
                  }
                }
                else if (bVar2 == 0x71) {
                  if (local_1ac != 0) {
                    main_cold_20();
                    goto LAB_00103c2d;
                  }
                  local_1ac = ParseInt((char *)pbVar22,0xb,(int)local_168,(int *)argv);
                  if (local_1ac == 0) {
                    pcVar15 = "error parsing quality value [%s]\n";
                    goto LAB_00103e5a;
                  }
                }
                else if (bVar2 == 0x77) {
                  if (local_1a0 != 0) {
                    main_cold_19();
                    goto LAB_00103c2d;
                  }
                  local_1a0 = ParseInt((char *)pbVar22,0x18,(int)local_168 + 4,(int *)argv);
                  if (local_1a0 == 0) {
                    pcVar15 = "error parsing lgwin value [%s]\n";
                    goto LAB_00103e5a;
                  }
                  ppcVar19 = (char **)CONCAT71((int7)((ulong)ppcVar19 >> 8),
                                               9 < (int)local_168._4_4_ || local_168._4_4_ == 0);
                  if (9 >= (int)local_168._4_4_ && local_168._4_4_ != 0) goto LAB_00103df3;
                }
              }
              else {
                ppcVar19 = (char **)(ulong)(bVar2 - 0x6e);
                switch(ppcVar19) {
                case (char **)0x0:
                  if (local_168._20_4_ == 0) {
                    main_cold_25();
                    goto LAB_00103c2d;
                  }
                  local_168._16_8_ = local_168._16_8_ & 0xffffffff;
                  break;
                case (char **)0x1:
                case (char **)0x3:
                case (char **)0x9:
                  goto switchD_00103210_caseD_1;
                case (char **)0x2:
                case (char **)0x4:
                case (char **)0x5:
                case (char **)0x7:
                  goto switchD_00103210_caseD_2;
                case (char **)0x6:
                  if (bVar4) {
                    main_cold_24();
                    goto LAB_00103c2d;
                  }
                  uVar8 = 4;
                  bVar18 = true;
                  break;
                case (char **)0x8:
                  if (0 < (int)local_168._8_4_) {
                    main_cold_23();
                    goto LAB_00103c2d;
                  }
                  local_168._8_4_ = 1;
                  break;
                default:
                  if (bVar2 == 0x5a) {
                    if (local_1ac == 0) {
                      local_168._0_4_ = 0xb;
                      goto LAB_0010313d;
                    }
                    main_cold_22();
                  }
                  else {
switchD_00103210_caseD_2:
                    pcVar15 = "invalid argument -%c\n";
LAB_00103c11:
                    fprintf(_stderr,pcVar15);
                  }
                  goto LAB_00103c2d;
                }
              }
            }
LAB_00103145:
            bVar4 = bVar18;
            lVar20 = lVar20 + 1;
            bVar18 = false;
          } while (sVar13 - 1 != lVar20);
        }
      }
LAB_00102ee3:
      iVar7 = iVar7 + 1;
    } while (iVar7 < argc);
    uVar23 = (uint)bVar3;
  }
  pbVar22 = local_138;
  auVar6 = stack0xfffffffffffffeb0;
  uStack_14c._4_4_ = -(uint)(uVar8 == 1) >> 0x1f;
  uStack_14c._0_4_ = -(uint)(uVar8 == 4) >> 0x1f;
  iStack_144 = auVar6._12_4_;
  local_168._24_4_ = auVar6._0_4_;
  uVar10 = 3;
  local_e0 = local_178;
  local_d8 = local_170;
  if (((1 < local_170 & (byte)uVar23) == 0) &&
     ((((uVar8 != 4 || ((local_140 == (byte *)0x0 && (local_168._24_4_ == 0)))) &&
       (pcVar15 = strchr((char *)local_138,0x2f), pcVar15 == (char *)0x0)) &&
      (((pcVar15 = strchr((char *)pbVar22,0x5c), pcVar15 == (char *)0x0 &&
        (uVar10 = uVar8, uVar8 < 5)) && ((0x13U >> uVar8 & 1) != 0)))))) {
    sVar13 = strlen((char *)pbVar22);
    pvVar16 = malloc(local_178 + sVar13 + 1);
    local_c0._0_8_ = pvVar16;
    local_a8 = (uint8_t *)malloc(0x100000);
    if ((pvVar16 == (void *)0x0) || (local_a8 == (uint8_t *)0x0)) {
      main_cold_29();
LAB_00103dac:
      bVar18 = true;
      goto LAB_00103d61;
    }
    local_98 = local_a8 + 0x80000;
    local_a0 = local_a8;
    if (uVar8 == 0) {
      do {
        iVar7 = NextFile((Context *)local_168);
        bVar18 = iVar7 != 0;
        if (iVar7 == 0) goto LAB_00103ba4;
        state_00 = BrotliEncoderCreateInstance
                             ((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
        if (state_00 == (BrotliEncoderState *)0x0) {
          main_cold_33();
          goto LAB_00103dac;
        }
        BrotliEncoderSetParameter(state_00,BROTLI_PARAM_QUALITY,local_168._0_4_);
        if ((int)local_168._4_4_ < 1) {
          value = 0x18;
          if (-1 < (long)local_80) {
            lVar20 = 10;
            do {
              if (local_80 <= (1L << ((byte)lVar20 & 0x3f)) - 0x10U) {
                value = (uint32_t)lVar20;
                break;
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != 0x18);
          }
        }
        else {
          value = local_168._4_4_;
          if (0x18 < (uint)local_168._4_4_) {
            BrotliEncoderSetParameter(state_00,BROTLI_PARAM_LARGE_WINDOW,1);
            value = local_168._4_4_;
          }
        }
        BrotliEncoderSetParameter(state_00,BROTLI_PARAM_LGWIN,value);
        if (0 < (long)local_80) {
          uVar21 = local_80;
          if (0x3fffffff < local_80) {
            uVar21 = 0x40000000;
          }
          BrotliEncoderSetParameter(state_00,BROTLI_PARAM_SIZE_HINT,(uint32_t)uVar21);
        }
        iVar7 = OpenFiles((Context *)local_168);
        if (iVar7 == 0) {
LAB_00103b6c:
          bVar25 = false;
          iVar7 = 0;
        }
        else {
          if ((((char *)local_90._8_8_ == (char *)0x0) && (local_168._12_4_ == 0)) &&
             (iVar7 = isatty(1), iVar7 != 0)) {
            main_cold_30();
            goto LAB_00103b6c;
          }
          local_68 = (undefined1  [16])0x0;
          local_58 = 0x80000;
          local_50 = local_98;
          local_48 = (undefined1  [16])0x0;
          bVar25 = false;
          do {
            if ((!bVar25) && (local_68._0_8_ == 0)) {
              iVar7 = ProvideInput((Context *)local_168);
              if (iVar7 == 0) goto LAB_00103b6c;
              iVar7 = feof((FILE *)local_78._0_8_);
              bVar25 = iVar7 != 0;
            }
            iVar7 = BrotliEncoderCompressStream
                              (state_00,(uint)bVar25 * 2,(size_t *)local_68,
                               (uint8_t **)(local_68 + 8),&local_58,&local_50,(size_t *)0x0);
            if (iVar7 == 0) {
              main_cold_32();
              goto LAB_00103b6c;
            }
            if (local_58 == 0) {
              iVar7 = WriteOutput((Context *)local_168);
              if (iVar7 == 0) goto LAB_00103b6c;
              local_58 = 0x80000;
              local_50 = local_98;
            }
            iVar7 = BrotliEncoderIsFinished(state_00);
          } while (iVar7 == 0);
          iVar7 = WriteOutput((Context *)local_168);
          if (iVar7 == 0) goto LAB_00103b6c;
          local_58 = 0;
          iVar7 = 1;
          bVar25 = true;
          if (0 < (int)local_168._8_4_) {
            main_cold_31();
          }
        }
        BrotliEncoderDestroyInstance(state_00);
        iVar7 = CloseFiles((Context *)local_168,iVar7);
      } while ((bVar25) && (iVar7 != 0));
      goto LAB_00103d61;
    }
    if ((uVar8 == 1) || (uVar8 == 4)) {
      do {
        iVar7 = NextFile((Context *)local_168);
        bVar18 = iVar7 != 0;
        if (iVar7 == 0) goto LAB_00103ba4;
        state = BrotliDecoderCreateInstance
                          ((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
        if (state == (BrotliDecoderState *)0x0) {
          main_cold_39();
          goto LAB_00103dac;
        }
        BrotliDecoderSetParameter(state,BROTLI_DECODER_PARAM_LARGE_WINDOW,1);
        iVar9 = 0;
        BrotliDecoderSetParameter(state,BROTLI_DECODER_PARAM_LARGE_WINDOW,0);
        iVar7 = OpenFiles((Context *)local_168);
        if (iVar7 == 0) {
          bVar25 = false;
        }
        else {
          if ((((char *)local_90._0_8_ != (char *)0x0) || (local_168._12_4_ != 0)) ||
             (iVar7 = isatty(0), iVar7 == 0)) {
            local_68 = (undefined1  [16])0x0;
            local_58 = 0x80000;
            local_50 = local_98;
            local_48 = (undefined1  [16])0x0;
            BVar11 = BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT;
            do {
              if (BVar11 == BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT) {
                iVar7 = feof((FILE *)local_78._0_8_);
                if (iVar7 != 0) {
                  main_cold_37();
                  goto LAB_001038e0;
                }
                iVar7 = ProvideInput((Context *)local_168);
                if (iVar7 == 0) goto LAB_001038e0;
              }
              else {
                if (BVar11 != BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT) {
                  if (BVar11 == BROTLI_DECODER_RESULT_SUCCESS) {
                    iVar7 = WriteOutput((Context *)local_168);
                    if (iVar7 != 0) {
                      local_58 = 0;
                      if (local_68._0_8_ == 0) {
                        iVar7 = fgetc((FILE *)local_78._0_8_);
                        if (iVar7 == -1) {
                          iVar9 = 1;
                          bVar25 = true;
                          if (0 < (int)local_168._8_4_) {
                            main_cold_36();
                          }
                          goto LAB_001038e6;
                        }
                      }
                      main_cold_35();
                    }
                  }
                  else {
                    main_cold_38();
                  }
                  goto LAB_001038e0;
                }
                iVar7 = WriteOutput((Context *)local_168);
                if (iVar7 == 0) goto LAB_001038e0;
                local_58 = 0x80000;
                local_50 = local_98;
              }
              BVar11 = BrotliDecoderDecompressStream
                                 (state,(size_t *)local_68,(uint8_t **)(local_68 + 8),&local_58,
                                  &local_50,(size_t *)0x0);
            } while( true );
          }
          main_cold_34();
LAB_001038e0:
          bVar25 = false;
          iVar9 = 0;
        }
LAB_001038e6:
        BrotliDecoderDestroyInstance(state);
        iVar7 = CloseFiles((Context *)local_168,iVar9);
      } while ((bVar25) && (iVar7 != 0));
      goto LAB_00103d61;
    }
  }
LAB_00103c32:
  pcVar15 = *argv;
  pcVar12 = strrchr(pcVar15,0x2f);
  pcVar24 = pcVar12 + 1;
  if (pcVar12 == (char *)0x0) {
    pcVar24 = pcVar15;
  }
  pcVar12 = strrchr(pcVar24,0x5c);
  pcVar15 = pcVar12 + 1;
  if (pcVar12 == (char *)0x0) {
    pcVar15 = pcVar24;
  }
  bVar18 = uVar10 != 2;
  if (uVar10 == 2) {
    puVar17 = (undefined8 *)&stderr;
  }
  else {
    puVar17 = (undefined8 *)&stdout;
  }
  __stream = (FILE *)*puVar17;
  fprintf(__stream,"Usage: %s [OPTION]... [FILE]...\n",pcVar15);
  fwrite("Options:\n  -#                          compression level (0-9)\n  -c, --stdout                write on standard output\n  -d, --decompress            decompress\n  -f, --force                 force output file overwrite\n  -h, --help                  display this help and exit\n"
         ,0x112,1,__stream);
  fwrite("  -j, --rm                    remove source file(s)\n  -k, --keep                  keep source file(s) (default)\n  -n, --no-copy-stat          do not copy source file(s) attributes\n  -o FILE, --output=FILE      output file (only if 1 input file)\n"
         ,0xf5,1,__stream);
  fprintf(__stream,"  -q NUM, --quality=NUM       compression level (%d-%d)\n",0,0xb);
  fwrite("  -t, --test                  test compressed file integrity\n  -v, --verbose               verbose mode\n"
         ,0x68,1,__stream);
  fprintf(__stream,
          "  -w NUM, --lgwin=NUM         set LZ77 window size (0, %d-%d)\n                              window size = 2**NUM - 16\n                              0 lets compressor choose the optimal value\n"
          ,10,0x18);
  fprintf(__stream,
          "  --large_window=NUM          use incompatible large-window brotli\n                              bitstream with window size (0, %d-%d)\n                              WARNING: this format is not compatible\n                              with brotli RFC 7932 and may not be\n                              decodable with regular brotli decoders\n"
          ,10,0x1e);
  fprintf(__stream,"  -S SUF, --suffix=SUF        output file suffix (default:\'%s\')\n",".br");
  fwrite("  -V, --version               display version and exit\n  -Z, --best                  use best compression level (11) (default)\nSimple options could be coalesced, i.e. \'-9kf\' is equivalent to \'-9 -k -f\'.\nWith no FILE, or when FILE is -, read standard input.\nAll arguments after \'--\' are treated as files.\n"
         ,0x130,1,__stream);
LAB_00103d61:
  iVar7 = local_b0;
  free((void *)local_c0._0_8_);
  free(local_a8);
  if ((!bVar18) && (iVar7 == 0)) {
    return 0;
  }
  exit(1);
LAB_00103ba4:
  bVar18 = false;
  goto LAB_00103d61;
}

Assistant:

int main(int argc, char** argv) {
  Command command;
  Context context;
  BROTLI_BOOL is_ok = BROTLI_TRUE;
  int i;

  context.quality = 11;
  context.lgwin = -1;
  context.verbosity = 0;
  context.force_overwrite = BROTLI_FALSE;
  context.junk_source = BROTLI_FALSE;
  context.copy_stat = BROTLI_TRUE;
  context.test_integrity = BROTLI_FALSE;
  context.write_to_stdout = BROTLI_FALSE;
  context.decompress = BROTLI_FALSE;
  context.large_window = BROTLI_FALSE;
  context.output_path = NULL;
  context.suffix = DEFAULT_SUFFIX;
  for (i = 0; i < MAX_OPTIONS; ++i) context.not_input_indices[i] = 0;
  context.longest_path_len = 1;
  context.input_count = 0;

  context.argc = argc;
  context.argv = argv;
  context.modified_path = NULL;
  context.iterator = 0;
  context.ignore = 0;
  context.iterator_error = BROTLI_FALSE;
  context.buffer = NULL;
  context.current_input_path = NULL;
  context.current_output_path = NULL;
  context.fin = NULL;
  context.fout = NULL;

  command = ParseParams(&context);

  if (command == COMMAND_COMPRESS || command == COMMAND_DECOMPRESS ||
      command == COMMAND_TEST_INTEGRITY) {
    if (is_ok) {
      size_t modified_path_len =
          context.longest_path_len + strlen(context.suffix) + 1;
      context.modified_path = (char*)malloc(modified_path_len);
      context.buffer = (uint8_t*)malloc(kFileBufferSize * 2);
      if (!context.modified_path || !context.buffer) {
        fprintf(stderr, "out of memory\n");
        is_ok = BROTLI_FALSE;
      } else {
        context.input = context.buffer;
        context.output = context.buffer + kFileBufferSize;
      }
    }
  }

  if (!is_ok) command = COMMAND_NOOP;

  switch (command) {
    case COMMAND_NOOP:
      break;

    case COMMAND_VERSION:
      PrintVersion();
      break;

    case COMMAND_COMPRESS:
      is_ok = CompressFiles(&context);
      break;

    case COMMAND_DECOMPRESS:
    case COMMAND_TEST_INTEGRITY:
      is_ok = DecompressFiles(&context);
      break;

    case COMMAND_HELP:
    case COMMAND_INVALID:
    default:
      is_ok = (command == COMMAND_HELP);
      PrintHelp(FileName(argv[0]), is_ok);
      break;
  }

  if (context.iterator_error) is_ok = BROTLI_FALSE;

  free(context.modified_path);
  free(context.buffer);

  if (!is_ok) exit(1);
  return 0;
}